

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *param_1)

{
  allocator<char> local_55 [20];
  allocator<char> local_41;
  string local_40;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *param_1_local;
  cmLocalGenerator *this_local;
  
  local_20 = param_1;
  param_1_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GetTargetDirectory called on cmLocalGenerator",&local_41);
  cmSystemTools::Error(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_55);
  std::allocator<char>::~allocator(local_55);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetTargetDirectory(
  const cmGeneratorTarget* /*unused*/) const
{
  cmSystemTools::Error("GetTargetDirectory"
                       " called on cmLocalGenerator");
  return "";
}